

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

Reg asm_fuseload(ASMState *as,IRRef ref,RegSet allow)

{
  IRIns *ir;
  byte bVar1;
  uint uVar2;
  int iVar3;
  Reg RVar4;
  RegSet allow_00;
  
  ir = as->ir + ref;
  if ((char)(ir->field_1).r < '\0') {
    bVar1 = (ir->field_1).o;
    if (bVar1 == 0x1c) {
      uVar2 = ~as->modset & as->freeset & 0xffff0000;
      if ((uVar2 & uVar2 - 1) == 0) {
LAB_00140fa3:
        asm_fuseloadk64(as,ir);
        return 0x20;
      }
      goto switchD_00140ff7_default;
    }
    if ((ref == 0x8000) || (bVar1 == 0x1d)) {
      uVar2 = ~as->modset & as->freeset & 0xbfef;
      if ((uVar2 & uVar2 - 1) == 0) {
        if (ref == 0x8000) {
          (as->mrm).ofs = -0xe30;
          (as->mrm).base = '\x0e';
          (as->mrm).idx = 0x80;
          return 0x20;
        }
        goto LAB_00140fa3;
      }
LAB_00141053:
      if (bVar1 == 0x45) {
LAB_0014105c:
        if ((ir->field_0).op1 == 0x7fff) {
          allow_00 = 0;
LAB_00141070:
          asm_fusefref(as,ir,allow_00);
          return 0x20;
        }
      }
    }
    else {
      if (ref <= as->fuseref) goto LAB_00141053;
      allow_00 = 0xbfef;
      if ((allow & 0xbfef) != 0) {
        allow_00 = allow;
      }
      switch(bVar1) {
      case 0x42:
      case 0x43:
      case 0x44:
        iVar3 = noconflict(as,ref,bVar1 + IR_EQ,0);
        if ((iVar3 != 0) && (9 < ((ir->field_1).t.irt & 0x1f) - 3)) {
          asm_fuseahuref(as,(uint)(ir->field_0).op1,allow_00);
          return 0x20;
        }
        break;
      case 0x45:
        uVar2 = (ir->field_1).t.irt & 0x1f;
        if ((uVar2 - 3 < 10 || (byte)((char)uVar2 - 0x13U) < 2) &&
           (iVar3 = noconflict(as,ref,IR_FSTORE,0), iVar3 != 0)) goto LAB_00141070;
        goto LAB_0014105c;
      case 0x46:
        if ((3 < ((ir->field_1).t.irt & 0x1f) - 0xf) &&
           (iVar3 = noconflict(as,ref,IR_XSTORE,0), iVar3 != 0)) {
          asm_fusexref(as,(uint)(ir->field_0).op1,allow_00);
          return 0x20;
        }
        break;
      case 0x47:
        if (((((ir->field_0).op2 & 9) == 0) && (iVar3 = noconflict(as,ref,IR_RETF,0), iVar3 != 0))
           && (9 < ((ir->field_1).t.irt & 0x1f) - 3)) {
          RVar4 = ra_alloc1(as,0x8000,allow_00);
          (as->mrm).base = (uint8_t)RVar4;
          iVar3 = (uint)(ir->field_0).op1 * 8 + -0x10;
          goto LAB_001411d8;
        }
        break;
      case 0x48:
        if (9 < ((ir->field_1).t.irt & 0x1f) - 3) {
          asm_fuseahuref(as,(uint)(ir->field_0).op1,allow_00);
          (as->mrm).ofs = (as->mrm).ofs + (uint)(ir->field_0).op2 * 8;
          return 0x20;
        }
      }
    }
switchD_00140ff7_default:
    if (((ref < 0x8001) || ((as->freeset & allow) != 0)) ||
       ((allow != 0 && (((ir->field_1).s == '\0' && (as->sectref <= ref)))))) {
      RVar4 = ra_allocref(as,ref,allow);
      return RVar4;
    }
  }
  else if (allow != 0) {
    bVar1 = (ir->field_1).r & 0x1f;
    as->weakset = as->weakset & (-2 << bVar1 | 0xfffffffeU >> 0x20 - bVar1);
    return (uint)(ir->field_1).r;
  }
  (as->mrm).base = '\x04';
  iVar3 = ra_spill(as,ir);
LAB_001411d8:
  (as->mrm).ofs = iVar3;
  (as->mrm).idx = 0x80;
  return 0x20;
}

Assistant:

static Reg asm_fuseload(ASMState *as, IRRef ref, RegSet allow)
{
  IRIns *ir = IR(ref);
  if (ra_hasreg(ir->r)) {
    if (allow != RSET_EMPTY) {  /* Fast path. */
      ra_noweak(as, ir->r);
      return ir->r;
    }
  fusespill:
    /* Force a spill if only memory operands are allowed (asm_x87load). */
    as->mrm.base = RID_ESP;
    as->mrm.ofs = ra_spill(as, ir);
    as->mrm.idx = RID_NONE;
    return RID_MRM;
  }
  if (ir->o == IR_KNUM) {
    RegSet avail = as->freeset & ~as->modset & RSET_FPR;
    lj_assertA(allow != RSET_EMPTY, "no register allowed");
    if (!(avail & (avail-1)))  /* Fuse if less than two regs available. */
      return asm_fuseloadk64(as, ir);
  } else if (ref == REF_BASE || ir->o == IR_KINT64) {
    RegSet avail = as->freeset & ~as->modset & RSET_GPR;
    lj_assertA(allow != RSET_EMPTY, "no register allowed");
    if (!(avail & (avail-1))) {  /* Fuse if less than two regs available. */
      if (ref == REF_BASE) {
#if LJ_GC64
	as->mrm.ofs = (int32_t)dispofs(as, &J2G(as->J)->jit_base);
	as->mrm.base = RID_DISPATCH;
#else
	as->mrm.ofs = ptr2addr(&J2G(as->J)->jit_base);
	as->mrm.base = RID_NONE;
#endif
	as->mrm.idx = RID_NONE;
	return RID_MRM;
      } else {
	return asm_fuseloadk64(as, ir);
      }
    }
  } else if (mayfuse(as, ref)) {
    RegSet xallow = (allow & RSET_GPR) ? allow : RSET_GPR;
    if (ir->o == IR_SLOAD) {
      if (!(ir->op2 & (IRSLOAD_PARENT|IRSLOAD_CONVERT)) &&
	  noconflict(as, ref, IR_RETF, 0) &&
	  !(LJ_GC64 && irt_isaddr(ir->t))) {
	as->mrm.base = (uint8_t)ra_alloc1(as, REF_BASE, xallow);
	as->mrm.ofs = 8*((int32_t)ir->op1-1-LJ_FR2) +
		      (!LJ_FR2 && (ir->op2 & IRSLOAD_FRAME) ? 4 : 0);
	as->mrm.idx = RID_NONE;
	return RID_MRM;
      }
    } else if (ir->o == IR_FLOAD) {
      /* Generic fusion is only ok for 32 bit operand (but see asm_comp). */
      if ((irt_isint(ir->t) || irt_isu32(ir->t) || irt_isaddr(ir->t)) &&
	  noconflict(as, ref, IR_FSTORE, 0)) {
	asm_fusefref(as, ir, xallow);
	return RID_MRM;
      }
    } else if (ir->o == IR_ALOAD || ir->o == IR_HLOAD || ir->o == IR_ULOAD) {
      if (noconflict(as, ref, ir->o + IRDELTA_L2S, 0) &&
	  !(LJ_GC64 && irt_isaddr(ir->t))) {
	asm_fuseahuref(as, ir->op1, xallow);
	return RID_MRM;
      }
    } else if (ir->o == IR_XLOAD) {
      /* Generic fusion is not ok for 8/16 bit operands (but see asm_comp).
      ** Fusing unaligned memory operands is ok on x86 (except for SIMD types).
      */
      if ((!irt_typerange(ir->t, IRT_I8, IRT_U16)) &&
	  noconflict(as, ref, IR_XSTORE, 0)) {
	asm_fusexref(as, ir->op1, xallow);
	return RID_MRM;
      }
    } else if (ir->o == IR_VLOAD && !(LJ_GC64 && irt_isaddr(ir->t))) {
      asm_fuseahuref(as, ir->op1, xallow);
      as->mrm.ofs += 8 * ir->op2;
      return RID_MRM;
    }
  }
  if (ir->o == IR_FLOAD && ir->op1 == REF_NIL) {
    asm_fusefref(as, ir, RSET_EMPTY);
    return RID_MRM;
  }
  if (!(as->freeset & allow) && !emit_canremat(ref) &&
      (allow == RSET_EMPTY || ra_hasspill(ir->s) || iscrossref(as, ref)))
    goto fusespill;
  return ra_allocref(as, ref, allow);
}